

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Apu.cpp
# Opt level: O2

void __thiscall Gb_Apu::Gb_Apu(Gb_Apu *this)

{
  Synth *this_00;
  Synth *this_01;
  Gb_Osc *pGVar1;
  long lVar2;
  Gb_Apu *pGVar3;
  
  this_00 = &this->square_synth;
  Blip_Synth<12,_1>::Blip_Synth(this_00);
  this_01 = &this->other_synth;
  Blip_Synth<8,_1>::Blip_Synth(this_01);
  (this->square1).synth = this_00;
  (this->square2).synth = this_00;
  (this->wave).synth = this_01;
  (this->noise).synth = this_01;
  this->oscs[0] = (Gb_Osc *)&this->square1;
  this->oscs[1] = (Gb_Osc *)&this->square2;
  this->oscs[2] = &(this->wave).super_Gb_Osc;
  this->oscs[3] = (Gb_Osc *)&this->noise;
  pGVar3 = this;
  for (lVar2 = 0x208; lVar2 != 0x21c; lVar2 = lVar2 + 5) {
    pGVar1 = pGVar3->oscs[0];
    pGVar1->regs = (uint8_t *)((long)this->oscs + lVar2);
    pGVar1->output = (Blip_Buffer *)0x0;
    pGVar1->outputs[0] = (Blip_Buffer *)0x0;
    pGVar1->outputs[1] = (Blip_Buffer *)0x0;
    pGVar1->outputs[2] = (Blip_Buffer *)0x0;
    pGVar1->outputs[3] = (Blip_Buffer *)0x0;
    pGVar3 = (Gb_Apu *)(pGVar3->oscs + 1);
  }
  this->frame_period = 0x4000;
  this->volume_unit = 0.000625;
  update_volume(this);
  reset(this);
  return;
}

Assistant:

Gb_Apu::Gb_Apu()
{
	square1.synth = &square_synth;
	square2.synth = &square_synth;
	wave.synth  = &other_synth;
	noise.synth = &other_synth;
	
	oscs [0] = &square1;
	oscs [1] = &square2;
	oscs [2] = &wave;
	oscs [3] = &noise;
	
	for ( int i = 0; i < osc_count; i++ )
	{
		Gb_Osc& osc = *oscs [i];
		osc.regs = &regs [i * 5];
		osc.output = 0;
		osc.outputs [0] = 0;
		osc.outputs [1] = 0;
		osc.outputs [2] = 0;
		osc.outputs [3] = 0;
	}
	
	set_tempo( 1.0 );
	volume( 1.0 );
	reset();
}